

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O0

void __thiscall
ConfidentialTxIn_ConstractorEmpty_Test::TestBody(ConfidentialTxIn_ConstractorEmpty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1d0;
  Message local_1c8;
  int local_1c0;
  uint32_t local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_1;
  Message local_1a0;
  int local_198 [5];
  uint32_t local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  ConfidentialTxIn txin1;
  ConfidentialTxIn_ConstractorEmpty_Test *this_local;
  
  cfd::core::ConfidentialTxIn::ConfidentialTxIn((ConfidentialTxIn *)&gtest_ar.message_);
  local_184 = cfd::core::AbstractTxIn::GetVout((AbstractTxIn *)&gtest_ar.message_);
  local_198[0] = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_180,"txin1.GetVout()","0",&local_184,local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1bc = cfd::core::AbstractTxIn::GetSequence((AbstractTxIn *)&gtest_ar.message_);
  local_1c0 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_1b8,"txin1.GetSequence()","0",&local_1bc,&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(ConfidentialTxIn, ConstractorEmpty) {
  ConfidentialTxIn txin1;
  EXPECT_EQ(txin1.GetVout(), 0);
  EXPECT_EQ(txin1.GetSequence(), 0);
}